

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterBuildTestDepsGccWithEmptyDepfileErrorsOut::RegisterBuildTestDepsGccWithEmptyDepfileErrorsOut
          (RegisterBuildTestDepsGccWithEmptyDepfileErrorsOut *this)

{
  RegisterTest(BuildTestDepsGccWithEmptyDepfileErrorsOut::Create,
               "BuildTest.DepsGccWithEmptyDepfileErrorsOut");
  return;
}

Assistant:

TEST_F(BuildTest, DepsGccWithEmptyDepfileErrorsOut) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc\n"
"  deps = gcc\n"
"build out: cc\n"));
  Dirty("out");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ("subcommand failed", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}